

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O0

int TPZShapeHDiv<pzshape::TPZShapePrism>::ComputeNConnectShapeF(int connect,int order)

{
  MElementType MVar1;
  int in_ESI;
  int in_EDI;
  MElementType thistype;
  size_t in_stack_00000408;
  char *in_stack_00000410;
  int local_4;
  
  MVar1 = pztopology::TPZPrism::Type();
  if (MVar1 == EOned) {
    local_4 = in_ESI;
    if (in_EDI < 2) {
      local_4 = 1;
    }
  }
  else if (MVar1 == ETriangle) {
    if (in_EDI < 5) {
      local_4 = in_ESI + 1;
    }
    else {
      local_4 = (in_ESI + 1) * (in_ESI + 1) + -1;
    }
  }
  else if (MVar1 == EQuadrilateral) {
    if (in_EDI < 5) {
      local_4 = in_ESI + 1;
    }
    else {
      local_4 = in_ESI * 2 * (in_ESI + 1);
    }
  }
  else if (MVar1 == ETetraedro) {
    if (in_EDI < 5) {
      local_4 = ((in_ESI + 1) * (in_ESI + 2)) / 2;
    }
    else {
      local_4 = (in_ESI * (in_ESI + 2) * (in_ESI + 3)) / 2;
    }
  }
  else if (MVar1 == EPrisma) {
    if ((in_EDI == 0) || (in_EDI == 4)) {
      local_4 = ((in_ESI + 1) * (in_ESI + 2)) / 2;
    }
    else if (in_EDI < 5) {
      local_4 = (in_ESI + 1) * (in_ESI + 1);
    }
    else {
      local_4 = (in_ESI * in_ESI * (in_ESI * 3 + 5)) / 2 + in_ESI * 7 + -2;
    }
  }
  else if (MVar1 == ECube) {
    if (in_EDI < 5) {
      local_4 = (in_ESI + 1) * (in_ESI + 1);
    }
    else {
      local_4 = in_ESI * 3 * (in_ESI + 1) * (in_ESI + 1);
    }
  }
  else {
    pzinternal::DebugStopImpl(in_stack_00000410,in_stack_00000408);
  }
  return local_4;
}

Assistant:

int TPZShapeHDiv<TSHAPE>::ComputeNConnectShapeF(int connect, int order)
{
#ifdef DEBUG
    if (connect < 0 || connect > TSHAPE::NFacets) {
        DebugStop();
    }
#endif
    // int order = data.fHDivConnectOrders[connect];
    MElementType thistype = TSHAPE::Type();

    if(thistype == EOned)
    {
        if(connect < 2) return 1;
        else return order;
    }
    else if(thistype == ETriangle)
    {
        if(connect < TSHAPE::NFacets) return (order+1);
        else return (order+1)*(order+1)-1;
    }
    else if(thistype == EQuadrilateral)
    {
        if(connect < TSHAPE::NFacets) return (order+1);
        else return 2*order*(order+1);
    }
    else if(thistype == ETetraedro)
    {
        if(connect < TSHAPE::NFacets) return (order+1)*(order+2)/2;
        else return order*(order+2)*(order+3)/2;
    }
    else if(thistype == EPrisma)
    {
        if(connect == 0 || connect == 4) return (order+1)*(order+2)/2;
        else if(connect < TSHAPE::NFacets) return (order+1)*(order+1);
        else return order*order*(3*order+5)/2+7*order-2;
    }
    else if(thistype == ECube)
    {
        if(connect < TSHAPE::NFacets) return (order+1)*(order+1);
        else return 3*order*(order+1)*(order+1);
    }
    DebugStop();
    unreachable();
 }